

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawTlatedAddColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  fixed_t fVar11;
  
  pBVar6 = dc_translation;
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar9 = (long)dc_pitch;
    pbVar8 = dc_dest;
    iVar7 = dc_count;
    fVar11 = dc_texturefrac;
    do {
      uVar10 = pDVar4[*pbVar8] + pDVar3[plVar1[pBVar6[pBVar5[fVar11 >> 0x10]]]] | 0x1f07c1f;
      *pbVar8 = RGB32k.All[uVar10 >> 0xf & uVar10];
      pbVar8 = pbVar8 + lVar9;
      fVar11 = fVar11 + fVar2;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

void R_DrawTlatedAddColumnP_C (void)
{
	int count;
	BYTE *dest;
	fixed_t frac;
	fixed_t fracstep;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		DWORD *fg2rgb = dc_srcblend;
		DWORD *bg2rgb = dc_destblend;
		BYTE *translation = dc_translation;
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;

		do
		{
			DWORD fg = colormap[translation[source[frac>>FRACBITS]]];
			DWORD bg = *dest;

			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg>>15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}
}